

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_delimited.pb.cc
# Opt level: O2

void editions_unittest::TestDelimited::MergeImpl(MessageLite *to_msg,MessageLite *from_msg)

{
  HasBits<1> *pHVar1;
  uint uVar2;
  MessageLite *pMVar3;
  MessageLite *pMVar4;
  char *failure_msg;
  void *pvVar5;
  int line;
  Arena *arena;
  TestDelimited *_this;
  TestDelimited *local_30;
  MessageLite *local_28 [2];
  
  arena = (Arena *)(to_msg->_internal_metadata_).ptr_;
  if (((ulong)arena & 1) != 0) {
    arena = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
  }
  local_30 = (TestDelimited *)to_msg;
  local_28[0] = from_msg;
  failure_msg = absl::lts_20250127::log_internal::
                Check_NEImpl<editions_unittest::TestDelimited_const*,editions_unittest::TestDelimited*>
                          ((TestDelimited **)local_28,&local_30,"&from != _this");
  if (failure_msg == (Nullable<const_char_*>)0x0) {
    uVar2 = (uint)from_msg[2]._internal_metadata_.ptr_;
    if ((uVar2 & 0x3f) != 0) {
      if ((uVar2 & 1) != 0) {
        pMVar3 = (MessageLite *)from_msg[3]._vptr_MessageLite;
        if (pMVar3 == (MessageLite *)0x0) {
          failure_msg = "from._impl_.lengthprefixed_ != nullptr";
          line = 0x817;
          goto LAB_00a4e584;
        }
        pMVar4 = *(MessageLite **)((long)&local_30->field_0 + 0x20);
        if (pMVar4 == (MessageLite *)0x0) {
          pvVar5 = google::protobuf::Arena::
                   CopyConstruct<editions_unittest::TestDelimited_LengthPrefixed>(arena,pMVar3);
          *(void **)((long)&local_30->field_0 + 0x20) = pvVar5;
        }
        else {
          TestDelimited_LengthPrefixed::MergeImpl(pMVar4,pMVar3);
        }
      }
      if ((uVar2 & 2) != 0) {
        pMVar3 = (MessageLite *)from_msg[3]._internal_metadata_.ptr_;
        if (pMVar3 == (MessageLite *)0x0) {
          failure_msg = "from._impl_.nested_ != nullptr";
          line = 0x81f;
          goto LAB_00a4e584;
        }
        pMVar4 = *(MessageLite **)((long)&local_30->field_0 + 0x28);
        if (pMVar4 == (MessageLite *)0x0) {
          pvVar5 = google::protobuf::Arena::CopyConstruct<editions_unittest::TestDelimited>
                             (arena,pMVar3);
          *(void **)((long)&local_30->field_0 + 0x28) = pvVar5;
        }
        else {
          MergeImpl(pMVar4,pMVar3);
        }
      }
      if ((uVar2 & 4) != 0) {
        pMVar3 = (MessageLite *)from_msg[4]._vptr_MessageLite;
        if (pMVar3 == (MessageLite *)0x0) {
          failure_msg = "from._impl_.grouplike_ != nullptr";
          line = 0x827;
          goto LAB_00a4e584;
        }
        pMVar4 = *(MessageLite **)((long)&local_30->field_0 + 0x30);
        if (pMVar4 == (MessageLite *)0x0) {
          pvVar5 = google::protobuf::Arena::
                   CopyConstruct<editions_unittest::TestDelimited_GroupLike>(arena,pMVar3);
          *(void **)((long)&local_30->field_0 + 0x30) = pvVar5;
        }
        else {
          TestDelimited_GroupLike::MergeImpl(pMVar4,pMVar3);
        }
      }
      if ((uVar2 & 8) != 0) {
        pMVar3 = (MessageLite *)from_msg[4]._internal_metadata_.ptr_;
        if (pMVar3 == (MessageLite *)0x0) {
          failure_msg = "from._impl_.notgrouplike_ != nullptr";
          line = 0x82f;
          goto LAB_00a4e584;
        }
        pMVar4 = *(MessageLite **)((long)&local_30->field_0 + 0x38);
        if (pMVar4 == (MessageLite *)0x0) {
          pvVar5 = google::protobuf::Arena::
                   CopyConstruct<editions_unittest::TestDelimited_GroupLike>(arena,pMVar3);
          *(void **)((long)&local_30->field_0 + 0x38) = pvVar5;
        }
        else {
          TestDelimited_GroupLike::MergeImpl(pMVar4,pMVar3);
        }
      }
      if ((uVar2 & 0x10) != 0) {
        pMVar3 = (MessageLite *)from_msg[5]._vptr_MessageLite;
        if (pMVar3 == (MessageLite *)0x0) {
          failure_msg = "from._impl_.notgrouplikescope_ != nullptr";
          line = 0x837;
          goto LAB_00a4e584;
        }
        pMVar4 = *(MessageLite **)((long)&local_30->field_0 + 0x40);
        if (pMVar4 == (MessageLite *)0x0) {
          pvVar5 = google::protobuf::Arena::CopyConstruct<editions_unittest::NotGroupLikeScope>
                             (arena,pMVar3);
          *(void **)((long)&local_30->field_0 + 0x40) = pvVar5;
        }
        else {
          NotGroupLikeScope::MergeImpl(pMVar4,pMVar3);
        }
      }
      if ((uVar2 & 0x20) != 0) {
        pMVar3 = (MessageLite *)from_msg[5]._internal_metadata_.ptr_;
        if (pMVar3 == (MessageLite *)0x0) {
          failure_msg = "from._impl_.messageimport_ != nullptr";
          line = 0x83f;
          goto LAB_00a4e584;
        }
        pMVar4 = *(MessageLite **)((long)&local_30->field_0 + 0x48);
        if (pMVar4 == (MessageLite *)0x0) {
          pvVar5 = google::protobuf::Arena::CopyConstruct<editions_unittest::MessageImport>
                             (arena,pMVar3);
          *(void **)((long)&local_30->field_0 + 0x48) = pvVar5;
        }
        else {
          MessageImport::MergeImpl(pMVar4,pMVar3);
        }
      }
    }
    pHVar1 = &(local_30->field_0)._impl_._has_bits_;
    pHVar1->has_bits_[0] = pHVar1->has_bits_[0] | uVar2;
    google::protobuf::internal::ExtensionSet::MergeFrom
              (&(local_30->field_0)._impl_._extensions_,
               (MessageLite *)_TestDelimited_default_instance_,(ExtensionSet *)(from_msg + 1));
    google::protobuf::internal::InternalMetadata::MergeFrom<google::protobuf::UnknownFieldSet>
              (&(local_30->super_Message).super_MessageLite._internal_metadata_,
               &from_msg->_internal_metadata_);
    return;
  }
  line = 0x810;
LAB_00a4e584:
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)local_28,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/google/protobuf/unittest_delimited.pb.cc"
             ,line,failure_msg);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_28);
}

Assistant:

void TestDelimited::MergeImpl(::google::protobuf::MessageLite& to_msg, const ::google::protobuf::MessageLite& from_msg) {
  auto* const _this = static_cast<TestDelimited*>(&to_msg);
  auto& from = static_cast<const TestDelimited&>(from_msg);
  ::google::protobuf::Arena* arena = _this->GetArena();
  // @@protoc_insertion_point(class_specific_merge_from_start:editions_unittest.TestDelimited)
  ABSL_DCHECK_NE(&from, _this);
  ::uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = from._impl_._has_bits_[0];
  if ((cached_has_bits & 0x0000003fu) != 0) {
    if ((cached_has_bits & 0x00000001u) != 0) {
      ABSL_DCHECK(from._impl_.lengthprefixed_ != nullptr);
      if (_this->_impl_.lengthprefixed_ == nullptr) {
        _this->_impl_.lengthprefixed_ = ::google::protobuf::Message::CopyConstruct(arena, *from._impl_.lengthprefixed_);
      } else {
        _this->_impl_.lengthprefixed_->MergeFrom(*from._impl_.lengthprefixed_);
      }
    }
    if ((cached_has_bits & 0x00000002u) != 0) {
      ABSL_DCHECK(from._impl_.nested_ != nullptr);
      if (_this->_impl_.nested_ == nullptr) {
        _this->_impl_.nested_ = ::google::protobuf::Message::CopyConstruct(arena, *from._impl_.nested_);
      } else {
        _this->_impl_.nested_->MergeFrom(*from._impl_.nested_);
      }
    }
    if ((cached_has_bits & 0x00000004u) != 0) {
      ABSL_DCHECK(from._impl_.grouplike_ != nullptr);
      if (_this->_impl_.grouplike_ == nullptr) {
        _this->_impl_.grouplike_ = ::google::protobuf::Message::CopyConstruct(arena, *from._impl_.grouplike_);
      } else {
        _this->_impl_.grouplike_->MergeFrom(*from._impl_.grouplike_);
      }
    }
    if ((cached_has_bits & 0x00000008u) != 0) {
      ABSL_DCHECK(from._impl_.notgrouplike_ != nullptr);
      if (_this->_impl_.notgrouplike_ == nullptr) {
        _this->_impl_.notgrouplike_ = ::google::protobuf::Message::CopyConstruct(arena, *from._impl_.notgrouplike_);
      } else {
        _this->_impl_.notgrouplike_->MergeFrom(*from._impl_.notgrouplike_);
      }
    }
    if ((cached_has_bits & 0x00000010u) != 0) {
      ABSL_DCHECK(from._impl_.notgrouplikescope_ != nullptr);
      if (_this->_impl_.notgrouplikescope_ == nullptr) {
        _this->_impl_.notgrouplikescope_ = ::google::protobuf::Message::CopyConstruct(arena, *from._impl_.notgrouplikescope_);
      } else {
        _this->_impl_.notgrouplikescope_->MergeFrom(*from._impl_.notgrouplikescope_);
      }
    }
    if ((cached_has_bits & 0x00000020u) != 0) {
      ABSL_DCHECK(from._impl_.messageimport_ != nullptr);
      if (_this->_impl_.messageimport_ == nullptr) {
        _this->_impl_.messageimport_ = ::google::protobuf::Message::CopyConstruct(arena, *from._impl_.messageimport_);
      } else {
        _this->_impl_.messageimport_->MergeFrom(*from._impl_.messageimport_);
      }
    }
  }
  _this->_impl_._has_bits_[0] |= cached_has_bits;
  _this->_impl_._extensions_.MergeFrom(&default_instance(), from._impl_._extensions_);
  _this->_internal_metadata_.MergeFrom<::google::protobuf::UnknownFieldSet>(from._internal_metadata_);
}